

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O1

BeliefUpperBound * __thiscall
despot::BaseRockSample::CreateBeliefUpperBound(BaseRockSample *this,string *name)

{
  int iVar1;
  RockSampleMDPBeliefUpperBound *this_00;
  ostream *poVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    this_00 = (RockSampleMDPBeliefUpperBound *)operator_new(0x10);
    despot::TrivialBeliefUpperBound::TrivialBeliefUpperBound
              ((TrivialBeliefUpperBound *)this_00,(DSPOMDP *)&this->super_BeliefMDP);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported belief lower bound: ");
        poVar2 = std::operator<<(poVar2,(string *)name);
        std::endl<char,std::char_traits<char>>(poVar2);
        exit(1);
      }
    }
    this_00 = (RockSampleMDPBeliefUpperBound *)operator_new(0x28);
    RockSampleMDPBeliefUpperBound::RockSampleMDPBeliefUpperBound(this_00,this);
  }
  return &this_00->super_BeliefUpperBound;
}

Assistant:

BeliefUpperBound* BaseRockSample::CreateBeliefUpperBound(string name) const {
	if (name == "TRIVIAL") {
		return new TrivialBeliefUpperBound(this);
	} else if (name == "DEFAULT" || name == "MDP") {
		return new RockSampleMDPBeliefUpperBound(this);
	} else {
		cerr << "Unsupported belief lower bound: " << name << endl;
		exit(1);
		return NULL;
	}
}